

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall glcts::AdvancedUsageDrawUpdateDraw::Setup(AdvancedUsageDrawUpdateDraw *this)

{
  AdvancedUsageDrawUpdateDraw *this_local;
  
  this->counter_buffer_ = 0;
  this->vbo_ = 0;
  this->vao_ = 0;
  this->prog_ = 0;
  this->prog2_ = 0;
  this->rt_[1] = 0;
  this->rt_[0] = 0;
  this->fbo_ = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		counter_buffer_ = 0;
		vao_ = vbo_ = 0;
		prog_		= 0;
		prog2_		= 0;
		fbo_ = rt_[0] = rt_[1] = 0;
		return NO_ERROR;
	}